

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v_draw.cpp
# Opt level: O0

void __thiscall DCanvas::PUTTRANSDOT(DCanvas *this,int xx,int yy,int basecolor,int level)

{
  int iVar1;
  uint uVar2;
  BYTE *pBVar3;
  DWORD bg;
  DWORD fg;
  DWORD *fg2rgb;
  DWORD *bg2rgb;
  BYTE *spot;
  int level_local;
  int basecolor_local;
  int yy_local;
  int xx_local;
  DCanvas *this_local;
  
  if (yy == PUTTRANSDOT::oldyy + 1) {
    PUTTRANSDOT::oldyy = PUTTRANSDOT::oldyy + 1;
    iVar1 = GetPitch(this);
    PUTTRANSDOT::oldyyshifted = iVar1 + PUTTRANSDOT::oldyyshifted;
  }
  else if (yy == PUTTRANSDOT::oldyy + -1) {
    PUTTRANSDOT::oldyy = PUTTRANSDOT::oldyy + -1;
    iVar1 = GetPitch(this);
    PUTTRANSDOT::oldyyshifted = PUTTRANSDOT::oldyyshifted - iVar1;
  }
  else if (yy != PUTTRANSDOT::oldyy) {
    PUTTRANSDOT::oldyy = yy;
    iVar1 = GetPitch(this);
    PUTTRANSDOT::oldyyshifted = yy * iVar1;
  }
  pBVar3 = GetBuffer(this);
  uVar2 = Col2RGB8[0x3f - level][basecolor] +
          Col2RGB8[level + 1][pBVar3[(long)xx + (long)PUTTRANSDOT::oldyyshifted]] | 0x1f07c1f;
  pBVar3[(long)xx + (long)PUTTRANSDOT::oldyyshifted] = RGB32k.All[uVar2 & uVar2 >> 0xf];
  return;
}

Assistant:

void DCanvas::PUTTRANSDOT (int xx, int yy, int basecolor, int level)
{
	static int oldyy;
	static int oldyyshifted;

#if 0
	if(xx < 32)
		cc += 7-(xx>>2);
	else if(xx > (finit_width - 32))
		cc += 7-((finit_width-xx) >> 2);
//	if(cc==oldcc) //make sure that we don't double fade the corners.
//	{
		if(yy < 32)
			cc += 7-(yy>>2);
		else if(yy > (finit_height - 32))
			cc += 7-((finit_height-yy) >> 2);
//	}
	if(cc > cm && cm != NULL)
	{
		cc = cm;
	}
	else if(cc > oldcc+6) // don't let the color escape from the fade table...
	{
		cc=oldcc+6;
	}
#endif
	if (yy == oldyy+1)
	{
		oldyy++;
		oldyyshifted += GetPitch();
	}
	else if (yy == oldyy-1)
	{
		oldyy--;
		oldyyshifted -= GetPitch();
	}
	else if (yy != oldyy)
	{
		oldyy = yy;
		oldyyshifted = yy * GetPitch();
	}

	BYTE *spot = GetBuffer() + oldyyshifted + xx;
	DWORD *bg2rgb = Col2RGB8[1+level];
	DWORD *fg2rgb = Col2RGB8[63-level];
	DWORD fg = fg2rgb[basecolor];
	DWORD bg = bg2rgb[*spot];
	bg = (fg+bg) | 0x1f07c1f;
	*spot = RGB32k.All[bg&(bg>>15)];
}